

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlGetUTF8Char(uchar *utf,int *len)

{
  uint local_24;
  uint c;
  int *len_local;
  uchar *utf_local;
  
  if (((utf == (uchar *)0x0) || (len == (int *)0x0)) || (*len < 1)) {
LAB_0023d2bc:
    if (len != (int *)0x0) {
      *len = 0;
    }
    utf_local._4_4_ = 0xffffffff;
  }
  else {
    local_24 = (uint)*utf;
    if ((*utf & 0x80) == 0) {
      *len = 1;
    }
    else {
      if ((*len < 2) || ((utf[1] & 0xc0) != 0x80)) goto LAB_0023d2bc;
      if ((local_24 & 0xe0) == 0xe0) {
        if ((*len < 3) || ((utf[2] & 0xc0) != 0x80)) goto LAB_0023d2bc;
        if ((local_24 & 0xf0) == 0xf0) {
          if (((*len < 4) || ((local_24 & 0xf8) != 0xf0)) || ((utf[3] & 0xc0) != 0x80))
          goto LAB_0023d2bc;
          *len = 4;
          local_24 = utf[3] & 0x3f |
                     (utf[2] & 0x3f) << 6 | (utf[1] & 0x3f) << 0xc | (*utf & 7) << 0x12;
        }
        else {
          *len = 3;
          local_24 = utf[2] & 0x3f | (utf[1] & 0x3f) << 6 | (*utf & 0xf) << 0xc;
        }
      }
      else {
        *len = 2;
        local_24 = utf[1] & 0x3f | (*utf & 0x1f) << 6;
      }
    }
    utf_local._4_4_ = local_24;
  }
  return utf_local._4_4_;
}

Assistant:

int
xmlGetUTF8Char(const unsigned char *utf, int *len) {
    unsigned int c;

    if (utf == NULL)
        goto error;
    if (len == NULL)
        goto error;
    if (*len < 1)
        goto error;

    c = utf[0];
    if (c & 0x80) {
        if (*len < 2)
            goto error;
        if ((utf[1] & 0xc0) != 0x80)
            goto error;
        if ((c & 0xe0) == 0xe0) {
            if (*len < 3)
                goto error;
            if ((utf[2] & 0xc0) != 0x80)
                goto error;
            if ((c & 0xf0) == 0xf0) {
                if (*len < 4)
                    goto error;
                if ((c & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
                    goto error;
                *len = 4;
                /* 4-byte code */
                c = (utf[0] & 0x7) << 18;
                c |= (utf[1] & 0x3f) << 12;
                c |= (utf[2] & 0x3f) << 6;
                c |= utf[3] & 0x3f;
            } else {
              /* 3-byte code */
                *len = 3;
                c = (utf[0] & 0xf) << 12;
                c |= (utf[1] & 0x3f) << 6;
                c |= utf[2] & 0x3f;
            }
        } else {
          /* 2-byte code */
            *len = 2;
            c = (utf[0] & 0x1f) << 6;
            c |= utf[1] & 0x3f;
        }
    } else {
        /* 1-byte code */
        *len = 1;
    }
    return(c);

error:
    if (len != NULL)
	*len = 0;
    return(-1);
}